

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall S2Loop::BoundaryNear(S2Loop *this,S2Loop *b,S1Angle max_error)

{
  pair<int,_int> *ppVar1;
  int iVar2;
  int iVar3;
  const_iterator cVar4;
  S2Point *pSVar5;
  S2Point *pSVar6;
  S2Point *pSVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  pair<int,_int> pVar11;
  int i;
  pair<int,_int> pVar12;
  bool bVar13;
  S1Angle SVar14;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  done;
  pair<int,_int> local_a8;
  uint local_9c;
  S2Loop *local_98;
  S2Loop *local_90;
  pair<int,_int> *local_88;
  iterator iStack_80;
  pair<int,_int> *local_78;
  ulong local_70;
  double local_68;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  iVar3 = this->num_vertices_;
  if ((iVar3 == 1) || (b->num_vertices_ == 1)) {
    if ((iVar3 != 1 || (this->origin_inside_ & 1U) != 0) ||
       ((b->num_vertices_ != 1 || (local_9c = 1, (b->origin_inside_ & 1U) != 0)))) {
      if ((iVar3 == 1 & this->origin_inside_) == 1) {
        local_9c = (uint)(byte)(b->num_vertices_ == 1 & b->origin_inside_);
      }
      else {
        local_9c = 0;
      }
    }
  }
  else {
    local_9c = (uint)CONCAT71((int7)((ulong)this >> 8),0 < this->num_vertices_);
    if (0 < this->num_vertices_) {
      local_70 = 0;
      local_98 = b;
      local_90 = this;
      local_68 = max_error.radians_;
      do {
        local_88 = (pair<int,_int> *)0x0;
        iStack_80._M_current = (pair<int,_int> *)0x0;
        local_78 = (pair<int,_int> *)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a8.first = 0;
        local_a8.second = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_88,
                   (iterator)0x0,&local_a8);
        bVar13 = local_88 != iStack_80._M_current;
        if (bVar13) {
          ppVar1 = iStack_80._M_current + -1;
          iVar3 = iStack_80._M_current[-1].first;
          i = iStack_80._M_current[-1].second;
          iStack_80._M_current = ppVar1;
          if (iVar3 != local_90->num_vertices_) goto LAB_0020138c;
          bVar13 = true;
          while (i != local_98->num_vertices_) {
LAB_0020138c:
            do {
              local_a8.second = i;
              local_a8.first = iVar3;
              std::
              _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              ::_M_insert_unique<std::pair<int,int>>
                        ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                          *)&local_60,&local_a8);
              iVar10 = iVar3 + (int)local_70;
              iVar2 = local_90->num_vertices_;
              iVar8 = iVar2;
              if (iVar10 < iVar2) {
                iVar8 = 0;
              }
              iVar10 = iVar10 - iVar8;
              if (iVar3 < iVar2) {
                pVar12.second = i;
                pVar12.first = iVar3 + 1;
                local_a8 = pVar12;
                cVar4 = std::
                        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        ::find(&local_60,&local_a8);
                if ((_Rb_tree_header *)cVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
                  pSVar5 = vertex(local_90,iVar10 + 1);
                  pSVar6 = vertex(local_98,i);
                  pSVar7 = vertex(local_98,i + 1);
                  SVar14 = S2::GetDistance(pSVar5,pSVar6,pSVar7);
                  if (SVar14.radians_ <= local_68) {
                    if (iStack_80._M_current == local_78) {
                      local_a8 = pVar12;
                      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                      _M_realloc_insert<std::pair<int,int>>
                                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                                 &local_88,iStack_80,&local_a8);
                    }
                    else {
                      *iStack_80._M_current = pVar12;
                      iStack_80._M_current = iStack_80._M_current + 1;
                      local_a8 = pVar12;
                    }
                  }
                }
              }
              if (i < local_98->num_vertices_) {
                pVar11.second = i + 1;
                pVar11.first = iVar3;
                local_a8 = pVar11;
                cVar4 = std::
                        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        ::find(&local_60,&local_a8);
                if ((_Rb_tree_header *)cVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
                  pSVar5 = vertex(local_98,i + 1);
                  pSVar6 = vertex(local_90,iVar10);
                  pSVar7 = vertex(local_90,iVar10 + 1);
                  SVar14 = S2::GetDistance(pSVar5,pSVar6,pSVar7);
                  if (SVar14.radians_ <= local_68) {
                    if (iStack_80._M_current == local_78) {
                      local_a8 = pVar11;
                      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                      _M_realloc_insert<std::pair<int,int>>
                                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                                 &local_88,iStack_80,&local_a8);
                    }
                    else {
                      *iStack_80._M_current = pVar11;
                      iStack_80._M_current = iStack_80._M_current + 1;
                      local_a8 = pVar11;
                    }
                  }
                }
              }
              bVar13 = local_88 != iStack_80._M_current;
              if (local_88 == iStack_80._M_current) goto LAB_00201539;
              ppVar1 = iStack_80._M_current + -1;
              iVar3 = iStack_80._M_current[-1].first;
              i = iStack_80._M_current[-1].second;
              iStack_80._M_current = ppVar1;
            } while (iVar3 != local_90->num_vertices_);
          }
        }
LAB_00201539:
        std::
        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        ::~_Rb_tree(&local_60);
        if (local_88 != (pair<int,_int> *)0x0) {
          operator_delete(local_88);
        }
        if (bVar13) break;
        uVar9 = (int)local_70 + 1;
        local_70 = (ulong)uVar9;
        local_9c = (uint)CONCAT71((int7)((ulong)local_90 >> 8),(int)uVar9 < local_90->num_vertices_)
        ;
      } while ((int)uVar9 < local_90->num_vertices_);
    }
  }
  return (bool)((byte)local_9c & 1);
}

Assistant:

bool S2Loop::BoundaryNear(const S2Loop& b, S1Angle max_error) const {
  // Special case to handle empty or full loops.
  if (is_empty_or_full() || b.is_empty_or_full()) {
    return (is_empty() && b.is_empty()) || (is_full() && b.is_full());
  }

  for (int a_offset = 0; a_offset < num_vertices(); ++a_offset) {
    if (MatchBoundaries(*this, b, a_offset, max_error)) return true;
  }
  return false;
}